

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O3

int __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::close(mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
        *this,int __fd)

{
  pointer args_2;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  pointer pdVar4;
  undefined8 *puVar5;
  select_case_t *psVar6;
  int iVar7;
  select_case_t *psVar8;
  composed_action_name local_40;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  if (this->m_status == closed) goto LAB_00210dc6;
  this->m_status = closed;
  sVar1 = (this->m_queue).m_max_size;
  sVar2 = (this->m_queue).m_size;
  if (__fd == 0) {
    if (sVar2 != 0) {
      do {
        details::
        ensure_queue_not_empty<so_5::mchain_props::details::limited_preallocated_demand_queue&>
                  (&this->m_queue);
        sVar3 = (this->m_queue).m_head;
        pdVar4 = (this->m_queue).m_storage.
                 super__Vector_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_40.m_1 = "service_request";
        args_2 = pdVar4 + sVar3;
        if (args_2->m_demand_type == event) {
          local_40.m_1 = "message";
        }
        local_40.m_2 = "dropped_on_close";
        impl::msg_tracing_helpers::details::
        make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
                  ((this->super_mchain_tracing_enabled_base).m_tracer,
                   &this->super_abstract_message_chain_t,&local_40,&args_2->m_msg_type,
                   &pdVar4[sVar3].m_message_ref);
        details::limited_preallocated_demand_queue::pop_front(&this->m_queue);
      } while ((this->m_queue).m_size != 0);
    }
LAB_00210d60:
    psVar8 = this->m_select_tail;
    if (psVar8 != (select_case_t *)0x0) {
      this->m_select_tail = (select_case_t *)0x0;
      do {
        puVar5 = *(undefined8 **)(psVar8 + 0x10);
        psVar6 = *(select_case_t **)(psVar8 + 0x18);
        *(undefined8 *)(psVar8 + 0x10) = 0;
        *(undefined8 *)(psVar8 + 0x18) = 0;
        (**(code **)*puVar5)();
        psVar8 = psVar6;
      } while (psVar6 != (select_case_t *)0x0);
    }
  }
  else if (sVar2 == 0) goto LAB_00210d60;
  if (this->m_threads_to_wakeup != 0) {
    std::condition_variable::notify_all();
  }
  if (sVar1 == sVar2) {
    std::condition_variable::notify_all();
  }
LAB_00210dc6:
  iVar7 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return iVar7;
}

Assistant:

virtual void
		close( close_mode_t mode ) override
			{
				std::lock_guard< std::mutex > lock{ m_lock };

				if( details::status::closed == m_status )
					return;

				m_status = details::status::closed;

				const bool was_full = m_queue.is_full();

				if( close_mode_t::drop_content == mode )
					{
						while( !m_queue.is_empty() )
							{
								this->trace_demand_drop_on_close(
										*this, m_queue.front() );
								m_queue.pop_front();
							}
					}

				// If queue is empty now and there is any multi chain select
				// than select_tail must be handled.
				if( m_queue.is_empty() )
					notify_multi_chain_select_ops();

				if( m_threads_to_wakeup )
					// Someone is waiting on empty chain for new messages.
					// It must be informed that no new messages will be here.
					m_underflow_cond.notify_all();

				if( was_full )
					// Someone can wait on full chain for free place for new message.
					// It must be informed that the chain is closed.
					m_overflow_cond.notify_all();
			}